

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

void __thiscall
testing::internal::
FieldsAreMatcherImpl<const_nsh_cmd_&,_testing::internal::IndexSequence<0UL,_1UL>_>::
DescribeNegationTo(FieldsAreMatcherImpl<const_nsh_cmd_&,_testing::internal::IndexSequence<0UL,_1UL>_>
                   *this,ostream *os)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(os,"");
  poVar1 = std::operator<<(poVar1,"has field #");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," that ");
  MatcherBase<nsh_status_(*const_&)(unsigned_int,_char_**)>::DescribeNegationTo
            ((MatcherBase<nsh_status_(*const_&)(unsigned_int,_char_**)> *)
             &(this->matchers_).
              super__Tuple_impl<0UL,_testing::Matcher<nsh_status_(*const_&)(unsigned_int,_char_**)>,_testing::Matcher<const_char_(&)[16]>_>
              .
              super__Head_base<0UL,_testing::Matcher<nsh_status_(*const_&)(unsigned_int,_char_**)>,_false>
             ,os);
  poVar1 = std::operator<<(os,", or ");
  poVar1 = std::operator<<(poVar1,"has field #");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," that ");
  MatcherBase<const_char_(&)[16]>::DescribeNegationTo
            ((MatcherBase<const_char_(&)[16]> *)&this->matchers_,os);
  return;
}

Assistant:

void DescribeNegationTo(::std::ostream* os) const override {
    const char* separator = "";
    VariadicExpand({(*os << separator << "has field #" << I << " that ",
                     std::get<I>(matchers_).DescribeNegationTo(os),
                     separator = ", or ")...});
  }